

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLinActuator::ArchiveIN(ChLinkLinActuator *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkLinActuator>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->offset;
  local_38._name = "offset";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->dist_funct;
  local_38._name = "dist_funct";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkLinActuator::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChLinkLinActuator>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(offset);
    marchive >> CHNVP(dist_funct);
}